

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

int parse_attr_token(char *str,char *attr_name,char **val,size_t *vallen)

{
  char cVar1;
  int iVar2;
  size_t len;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  
  *val = (char *)0x0;
  *vallen = 0;
  len = strlen(attr_name);
  pcVar3 = strchr(str,0x3b);
  do {
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    do {
      pcVar6 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
      iVar2 = isspace((int)*pcVar6);
    } while (iVar2 != 0);
    iVar2 = memicmp(pcVar3,attr_name,len);
    if (iVar2 == 0) {
      pcVar6 = pcVar3 + len;
      do {
        pcVar3 = pcVar6;
        cVar1 = *pcVar3;
        iVar2 = isspace((int)cVar1);
        pcVar6 = pcVar3 + 1;
      } while (iVar2 != 0);
      if (cVar1 == '=') {
        do {
          pcVar3 = pcVar6;
          cVar1 = *pcVar3;
          iVar2 = isspace((int)cVar1);
          pcVar6 = pcVar3 + 1;
        } while (iVar2 != 0);
        if (cVar1 == '\"') {
          *val = pcVar6;
          for (pcVar5 = pcVar6; (pcVar3 = pcVar6, *pcVar5 != '\0' && (*pcVar5 != '\"'));
              pcVar5 = pcVar5 + 1) {
          }
        }
        else {
          *val = pcVar3;
          cVar1 = *pcVar3;
          pcVar5 = pcVar3;
          while ((cVar1 != '\0' && (pvVar4 = memchr(" \t;,",(int)cVar1,5), pvVar4 == (void *)0x0)))
          {
            cVar1 = pcVar5[1];
            pcVar5 = pcVar5 + 1;
          }
        }
        *vallen = (long)pcVar5 - (long)pcVar3;
        return 1;
      }
    }
    pcVar3 = strchr(pcVar3,0x3b);
  } while( true );
}

Assistant:

static int parse_attr_token(const char *str, const char *attr_name,
                            const char *&val, size_t &vallen)
{
    /* assume we won't find anything */
    val = 0;
    vallen = 0;

    /* note the name length */
    size_t attr_name_len = strlen(attr_name);

    /* scan the string for attribute tokens, starting at the first ';' */
    for (const char *p = strchr(str, ';') ; p != 0 ; p = strchr(p, ';'))
    {
        /* skip spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* check to see if this is the desired attribute name */
        if (memicmp(p, attr_name, attr_name_len) != 0)
            continue;

        /* skip the name and any subsequent spaces, and look for the '=' */
        for (p += attr_name_len ; isspace(*p) ; ++p) ;
        if (*p != '=')
            continue;

        /* skip the '=' and subsequent spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* 
         *   Okay, we're at the attribute value.  If there's a quote mark,
         *   the value is everything from here to the close quote.  Otherwise
         *   it's everything up to the next space or semicolon.  
         */
        if (*p == '"')
        {
            /* skip the open quote, and find the close quote */
            for (val = ++p ; *p != '\0' && *p != '"' ; ++p) ;
        }
        else
        {
            /* it's from here to the next separator character */
            val = p;
            for ( ; *p != '\0' && strchr(" \t;,", *p) == 0 ; ++p) ;
        }

        /* note the length, and return success */
        vallen = p - val;
        return TRUE;
    }

    /* didn't find it - return failure */
    return FALSE;
}